

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::DeviceContextVkImpl::WaitForIdle(DeviceContextVkImpl *this)

{
  RenderDeviceVkImpl *this_00;
  SoftwareQueueIndex QueueInd;
  string msg;
  string local_30;
  
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
    FormatString<char[37]>(&local_30,(char (*) [37])"Only immediate contexts can be idled");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"WaitForIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xb3e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  Flush(this,0,(ICommandList **)0x0);
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  QueueInd = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                       (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  ::IdleCommandQueue(&this_00->
                      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                     ,QueueInd,true);
  return;
}

Assistant:

void DeviceContextVkImpl::WaitForIdle()
{
    DEV_CHECK_ERR(!IsDeferred(), "Only immediate contexts can be idled");
    Flush();
    m_pDevice->IdleCommandQueue(GetCommandQueueId(), true);
}